

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latexOutline.cpp
# Opt level: O0

optional<OutlineCommandData> *
getArgumentToCommand
          (optional<OutlineCommandData> *__return_storage_ptr__,TSNode commandNode,File *file,
          bool hasStar)

{
  TSNode node_00;
  TSNode self;
  undefined1 auVar1 [24];
  TSNode self_00;
  TSNode self_01;
  TSNode self_02;
  TSNode self_03;
  TSNode self_04;
  TSNode self_05;
  initializer_list<char16_t> __l;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  TSPoint TVar5;
  reference pvVar6;
  TSTree *in_stack_fffffffffffffc78;
  uint32_t local_300 [2];
  uint32_t local_2f8 [2];
  uint32_t local_2f0 [2];
  void *local_2e8;
  allocator<char16_t> local_2db;
  value_type local_2da;
  iterator local_2d8;
  size_type local_2d0;
  u16string local_2c8;
  UtfHandler local_2a8;
  OutlineCommandData local_248;
  allocator<char> local_211;
  OutlineCommandData local_210;
  int local_1dc;
  value_type local_1d6;
  uint local_1d4;
  value_type c;
  size_type sStack_1d0;
  uint i;
  size_type len;
  u16string text_1;
  Point local_180;
  Point point;
  OutlineCommandData local_118;
  uint32_t local_e8 [2];
  uint32_t auStack_e0 [2];
  uint32_t local_d8 [2];
  void *pvStack_d0;
  undefined1 local_c0 [8];
  string text;
  undefined1 auStack_40 [8];
  TSNode node;
  bool sawStar;
  bool s_whitespace;
  bool hasStar_local;
  File *file_local;
  
  node.tree._6_1_ = 1;
  node.tree._5_1_ = 0;
  auVar1 = commandNode._8_24_;
  self.tree = in_stack_fffffffffffffc78;
  self.context[0] = auVar1._0_4_;
  self.context[1] = auVar1._4_4_;
  self.context[2] = auVar1._8_4_;
  self.context[3] = auVar1._12_4_;
  self.id = (void *)auVar1._16_8_;
  node.tree._7_1_ = hasStar;
  ts_node_next_named_sibling(self);
  do {
    self_00.context[2] = node.context[2];
    self_00.context[3] = node.context[3];
    self_00.context[0] = node.context[0];
    self_00.context[1] = node.context[1];
    self_00.id = node.id;
    self_00.tree = in_stack_fffffffffffffc78;
    _Var2 = ts_node_is_null(self_00);
    if (((_Var2 ^ 0xffU) & 1) == 0) {
      std::optional<OutlineCommandData>::optional(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    text.field_2._8_8_ = auStack_40;
    self_01.context[2] = node.context[2];
    self_01.context[3] = node.context[3];
    self_01.context[0] = node.context[0];
    self_01.context[1] = node.context[1];
    self_01.id = node.id;
    self_01.tree = in_stack_fffffffffffffc78;
    pcVar4 = ts_node_type(self_01);
    iVar3 = strcmp(pcVar4,"group");
    if (iVar3 == 0) {
      local_d8[0] = node.context[2];
      local_d8[1] = node.context[3];
      pvStack_d0 = node.id;
      local_e8[0] = auStack_40._0_4_;
      local_e8[1] = auStack_40._4_4_;
      auStack_e0[0] = node.context[0];
      auStack_e0[1] = node.context[1];
      node_00.context[2] = node.context[0];
      node_00.context[3] = node.context[1];
      node_00.context[0] = auStack_40._0_4_;
      node_00.context[1] = auStack_40._4_4_;
      node_00.id = (void *)node.context._8_8_;
      node_00.tree = (TSTree *)node.id;
      getGroupText_abi_cxx11_((string *)local_c0,node_00,file);
      std::__cxx11::string::string((string *)&local_118,(string *)local_c0);
      self_02.context[2] = node.context[2];
      self_02.context[3] = node.context[3];
      self_02.context[0] = node.context[0];
      self_02.context[1] = node.context[1];
      self_02.id = node.id;
      self_02.tree = in_stack_fffffffffffffc78;
      TVar5 = ts_node_end_point(self_02);
      local_118.endPoint = fromTSPoint(TVar5);
      local_118.sawStar = (bool)(node.tree._5_1_ & 1);
      std::optional<OutlineCommandData>::optional<OutlineCommandData,_true>
                (__return_storage_ptr__,&local_118);
      OutlineCommandData::~OutlineCommandData(&local_118);
      std::__cxx11::string::~string((string *)local_c0);
      return __return_storage_ptr__;
    }
    self_03.context[2] = node.context[2];
    self_03.context[3] = node.context[3];
    self_03.context[0] = node.context[0];
    self_03.context[1] = node.context[1];
    self_03.id = node.id;
    self_03.tree = in_stack_fffffffffffffc78;
    pcVar4 = ts_node_type(self_03);
    iVar3 = strcmp(pcVar4,"text");
    if (iVar3 == 0) {
      text_1.field_2._8_8_ = auStack_40;
      self_04.context[2] = node.context[2];
      self_04.context[3] = node.context[3];
      self_04.context[0] = node.context[0];
      self_04.context[1] = node.context[1];
      self_04.id = node.id;
      self_04.tree = in_stack_fffffffffffffc78;
      TVar5 = ts_node_start_point(self_04);
      local_180 = fromTSPoint(TVar5);
      File::textForNode_abi_cxx11_((u16string *)&len,file,(TSNode *)auStack_40);
      sStack_1d0 = std::__cxx11::
                   basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                   size((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                         *)&len);
      for (local_1d4 = 0; local_1d4 < sStack_1d0; local_1d4 = local_1d4 + 1) {
        pvVar6 = std::__cxx11::
                 basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                 operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                             *)&len,(ulong)local_1d4);
        local_1d6 = *pvVar6;
        local_180.column = local_180.column + 1;
        if ((local_1d6 != L' ') && (local_1d6 != L'\t')) {
          if (local_1d6 == L'%') {
            node.tree._6_1_ = 0;
            do {
              if (sStack_1d0 <= local_1d4) break;
              local_1d4 = local_1d4 + 1;
              pvVar6 = std::__cxx11::
                       basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                       ::operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                                     *)&len,(ulong)local_1d4);
            } while (*pvVar6 != L'\n');
            local_180.column = 0;
            local_180.row = local_180.row + 1;
          }
          else if (local_1d6 == L'\n') {
            if ((node.tree._6_1_ & 1) == 0) {
              std::optional<OutlineCommandData>::optional(__return_storage_ptr__);
              local_1dc = 1;
              goto LAB_00220676;
            }
            local_180.column = 0;
            local_180.row = local_180.row + 1;
            node.tree._6_1_ = 0;
          }
          else {
            if (local_1d6 != L'*') {
              local_2a8.converter._M_count = 0;
              local_2a8.converter._M_with_cvtstate = false;
              local_2a8.converter._M_with_strings = false;
              local_2a8.converter._90_6_ = 0;
              local_2a8.converter._M_wide_err_string.field_2._8_8_ = 0;
              local_2a8.converter._M_state.__count = 0;
              local_2a8.converter._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
              local_2a8.converter._M_wide_err_string._M_string_length = 0;
              local_2a8.converter._M_wide_err_string.field_2._M_allocated_capacity = 0;
              local_2a8.converter._M_byte_err_string.field_2._8_8_ = 0;
              local_2a8.converter._M_wide_err_string._M_dataplus._M_p = (pointer)0x0;
              local_2a8.converter._M_byte_err_string._M_string_length = 0;
              local_2a8.converter._M_byte_err_string.field_2._M_allocated_capacity = 0;
              local_2a8.converter._M_cvt._M_t.
              super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
              .
              super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>,_true,_true>
                    )(__uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
                      )0x0;
              local_2a8.converter._M_byte_err_string._M_dataplus = (_Alloc_hider)0x0;
              local_2a8.converter._M_byte_err_string._1_7_ = 0;
              UtfHandler::UtfHandler(&local_2a8);
              local_2da = local_1d6;
              local_2d8 = &local_2da;
              local_2d0 = 1;
              std::allocator<char16_t>::allocator(&local_2db);
              __l._M_len = local_2d0;
              __l._M_array = local_2d8;
              std::__cxx11::u16string::u16string((u16string *)&local_2c8,__l,&local_2db);
              UtfHandler::utf16to8(&local_248.name,&local_2a8,&local_2c8);
              local_248.endPoint = local_180;
              local_248.sawStar = (bool)(node.tree._5_1_ & 1);
              std::optional<OutlineCommandData>::optional<OutlineCommandData,_true>
                        (__return_storage_ptr__,&local_248);
              OutlineCommandData::~OutlineCommandData(&local_248);
              std::__cxx11::u16string::~u16string((u16string *)&local_2c8);
              std::allocator<char16_t>::~allocator(&local_2db);
              UtfHandler::~UtfHandler(&local_2a8);
              local_1dc = 1;
              goto LAB_00220676;
            }
            if ((node.tree._7_1_ & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_210,"*",&local_211);
              local_210.endPoint = local_180;
              local_210.sawStar = (bool)(node.tree._5_1_ & 1);
              std::optional<OutlineCommandData>::optional<OutlineCommandData,_true>
                        (__return_storage_ptr__,&local_210);
              OutlineCommandData::~OutlineCommandData(&local_210);
              std::allocator<char>::~allocator(&local_211);
              local_1dc = 1;
              goto LAB_00220676;
            }
            node.tree._5_1_ = 1;
            node.tree._7_1_ = 0;
          }
        }
      }
      local_1dc = 0;
LAB_00220676:
      std::__cxx11::u16string::~u16string((u16string *)&len);
      if (local_1dc != 0) {
        return __return_storage_ptr__;
      }
    }
    self_05.context[2] = node.context[2];
    self_05.context[3] = node.context[3];
    self_05.context[0] = node.context[0];
    self_05.context[1] = node.context[1];
    self_05.id = node.id;
    self_05.tree = in_stack_fffffffffffffc78;
    ts_node_next_named_sibling(self_05);
    auStack_40 = (undefined1  [8])local_300;
    node.context._0_8_ = local_2f8;
    node.context._8_8_ = local_2f0;
    node.id = local_2e8;
  } while( true );
}

Assistant:

std::optional<OutlineCommandData> getArgumentToCommand (TSNode commandNode, File &file, bool hasStar) {
    bool s_whitespace { true };
    bool sawStar { false };

    TSNode node = ts_node_next_named_sibling(commandNode);
    while (!ts_node_is_null(node)) {

        if (NODE_NAME_IS(node, "group")) {
            string text = getGroupText(node, file);

            return OutlineCommandData {
                text,
                fromTSPoint(ts_node_end_point(node)),
                sawStar
            };
        }

        if (NODE_NAME_IS(node, "text")) {
            Point point = fromTSPoint(ts_node_start_point(node));
            auto text = file.textForNode(node);
            auto len = text.size();

            for (unsigned int i = 0; i < len; i++) {
                auto c = text[i];
                point.column++; // points to column right of char

                if (c == ' ' || c == '\t') {
                    continue;
                } else if (c == '%') {
                    s_whitespace = false;
                    while (i < len) {
                        i++;
                        if (text[i] == '\n') { break; }
                    }
                    point.row++;
                    point.column = 0;
                } else if (c == '\n') {
                    if (!s_whitespace) {
                        return {};
                    }
                    point.row++;
                    point.column = 0;
                    s_whitespace = false;
                } else if (c == '*') {
                    if (hasStar) {
                        sawStar = true;
                        hasStar = false;
                    } else {
                        return OutlineCommandData{
                            "*",
                            point,
                            sawStar
                        };
                    }
                } else {
                    return OutlineCommandData {
                            UtfHandler().utf16to8(u16string { c }),
                            point,
                            sawStar
                    };
                }
            }
        }

        node = ts_node_next_named_sibling(node);
    }

    return {};
}